

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.h
# Opt level: O0

Box * __thiscall libDAI::Box::operator*=(Box *this,Box *c)

{
  Box *in_RDI;
  
  TProb<double>::operator*=((TProb<double> *)this,(TProb<double> *)c);
  TProb<double>::operator*=((TProb<double> *)this,(TProb<double> *)c);
  return in_RDI;
}

Assistant:

Box& operator*= (const Box &c) {
//#ifdef DEBUG
                assert( _min <= _max );
                assert( c._min <= c._max );
//#endif
                assert( _vars == c._vars );
                _min *= c._min;
                _max *= c._max;
                return *this;
            }